

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBooleanStateQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::BooleanStateQueryTests::init
          (BooleanStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  char cVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Context *pCVar4;
  uint uVar5;
  int iVar6;
  TestNode *node;
  long *plVar7;
  undefined4 extraout_var;
  long *extraout_RAX;
  long *plVar8;
  StateBoolean isEnableds [4];
  allocator<char> local_141;
  TestNode *local_140;
  char **local_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long *local_d8 [2];
  long local_c8 [2];
  char *local_b8 [2];
  undefined4 local_a8;
  undefined1 local_a4;
  undefined4 local_a0;
  char *local_98;
  char *local_90;
  undefined4 local_88;
  undefined1 local_84;
  undefined4 local_80;
  char *local_78;
  char *local_70;
  undefined4 local_68;
  byte local_64;
  undefined4 local_60;
  char *local_58;
  char *local_50;
  undefined4 local_48;
  undefined1 local_44;
  undefined4 local_40;
  
  local_140 = (TestNode *)this;
  uVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  local_64 = (byte)(uVar5 >> 0xb) & 1;
  local_b8[0] = "sample_mask";
  local_b8[1] = "SAMPLE_MASK";
  local_a8 = 0x8e51;
  local_f0 = 0;
  local_a4 = 0;
  local_a0 = 0x13;
  local_98 = "sample_shading";
  local_90 = "SAMPLE_SHADING";
  local_88 = 0x8c36;
  local_84 = 0;
  local_80 = 0x23;
  local_78 = "debug_output";
  local_70 = "DEBUG_OUTPUT";
  local_68 = 0x92e0;
  local_60 = 0x23;
  local_58 = "debug_output_synchronous";
  local_50 = "DEBUG_OUTPUT_SYNCHRONOUS";
  local_48 = 0x8242;
  local_44 = 0;
  local_40 = 0x23;
  do {
    local_138 = local_b8 + local_f0 * 4;
    local_e8 = 0;
    do {
      local_e0 = (long)*(int *)((long)init::isEnabledVerifiers + local_e8);
      node = (TestNode *)operator_new(0xa0);
      pCVar4 = (Context *)local_140[1]._vptr_TestNode;
      std::__cxx11::string::string<std::allocator<char>>((string *)local_d8,*local_138,&local_141);
      plVar7 = (long *)std::__cxx11::string::append((char *)local_d8);
      plVar8 = plVar7 + 2;
      if ((long *)*plVar7 == plVar8) {
        local_120 = *plVar8;
        lStack_118 = plVar7[3];
        local_130 = &local_120;
      }
      else {
        local_120 = *plVar8;
        local_130 = (long *)*plVar7;
      }
      local_128 = plVar7[1];
      *plVar7 = (long)plVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_130);
      plVar8 = plVar7 + 2;
      if ((long *)*plVar7 == plVar8) {
        local_100 = *plVar8;
        lStack_f8 = plVar7[3];
        local_110 = &local_100;
      }
      else {
        local_100 = *plVar8;
        local_110 = (long *)*plVar7;
      }
      local_108 = plVar7[1];
      *plVar7 = (long)plVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      uVar2 = *(undefined4 *)(local_138 + 2);
      cVar1 = *(char *)((long)local_138 + 0x14);
      uVar3 = *(undefined4 *)(local_138 + 3);
      tcu::TestCase::TestCase((TestCase *)node,pCVar4->m_testCtx,(char *)local_110,local_138[1]);
      node->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a3670;
      node[1]._vptr_TestNode = (_func_int **)pCVar4;
      iVar6 = (*pCVar4->m_renderCtx->_vptr_RenderContext[3])();
      glu::CallLogWrapper::CallLogWrapper
                ((CallLogWrapper *)&node[1].m_testCtx,(Functions *)CONCAT44(extraout_var,iVar6),
                 pCVar4->m_testCtx->m_log);
      node->_vptr_TestNode = (_func_int **)&PTR__IsEnabledStateTestCase_021af1f8;
      *(undefined4 *)((long)&node[1].m_name._M_string_length + 4) = uVar2;
      node[1].m_name.field_2._M_local_buf[0] = cVar1;
      *(int *)((long)&node[1].m_name.field_2 + 4) = (int)local_e0;
      *(undefined4 *)((long)&node[1].m_name.field_2 + 8) = uVar3;
      tcu::TestNode::addChild(local_140,node);
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_130 != &local_120) {
        operator_delete(local_130,local_120 + 1);
      }
      plVar7 = local_c8;
      if (local_d8[0] != plVar7) {
        operator_delete(local_d8[0],local_c8[0] + 1);
        plVar7 = extraout_RAX;
      }
      local_e8 = local_e8 + 4;
    } while (local_e8 != 0x14);
    local_f0 = local_f0 + 1;
  } while (local_f0 != 4);
  return (int)plVar7;
}

Assistant:

void BooleanStateQueryTests::init (void)
{
	const bool isDebugContext = (m_context.getRenderContext().getType().getFlags() & glu::CONTEXT_DEBUG) != 0;

	static const QueryType isEnabledVerifiers[] =
	{
		QUERY_ISENABLED,
		QUERY_BOOLEAN,
		QUERY_INTEGER,
		QUERY_INTEGER64,
		QUERY_FLOAT
	};

#define FOR_EACH_VERIFIER(VERIFIERS, X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(VERIFIERS); ++verifierNdx)	\
	{																						\
		const char* verifierSuffix = getVerifierSuffix((VERIFIERS)[verifierNdx]);			\
		const QueryType verifier = (VERIFIERS)[verifierNdx];								\
		this->addChild(X);																	\
	}

	struct StateBoolean
	{
		const char*		name;
		const char*		description;
		glw::GLenum		targetName;
		bool			value;
		glu::ApiType	minimumContext;
	};

	{
		const StateBoolean isEnableds[] =
		{
			{ "sample_mask",				"SAMPLE_MASK",				GL_SAMPLE_MASK,					false,			glu::ApiType::es(3, 1)},
			{ "sample_shading",				"SAMPLE_SHADING",			GL_SAMPLE_SHADING,				false,			glu::ApiType::es(3, 2)},
			{ "debug_output",				"DEBUG_OUTPUT",				GL_DEBUG_OUTPUT,				isDebugContext,	glu::ApiType::es(3, 2)},
			{ "debug_output_synchronous",	"DEBUG_OUTPUT_SYNCHRONOUS",	GL_DEBUG_OUTPUT_SYNCHRONOUS,	false,			glu::ApiType::es(3, 2)},
		};

		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(isEnableds); testNdx++)
		{
			FOR_EACH_VERIFIER(isEnabledVerifiers, new IsEnabledStateTestCase(m_context, verifier, (std::string(isEnableds[testNdx].name) + "_" + verifierSuffix).c_str(), isEnableds[testNdx].description, isEnableds[testNdx].targetName, isEnableds[testNdx].value, isEnableds[testNdx].minimumContext));
		}
	}

#undef FOR_EACH_VERIFIER
}